

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O3

VkDescriptorBufferInfo * __thiscall
vkt::ubo::anon_unknown_0::UniformBlockCaseInstance::addUniformData
          (VkDescriptorBufferInfo *__return_storage_ptr__,UniformBlockCaseInstance *this,
          deUint32 size,void *dataPtr)

{
  deInt32 *pdVar1;
  VkDeviceSize *pVVar2;
  int *piVar3;
  int iVar4;
  DeviceInterface *vkd;
  Allocation *pAVar5;
  VkDescriptorBufferInfo *pVVar6;
  undefined4 extraout_var;
  VkDescriptorBufferInfo *extraout_RAX;
  ulong bufferSize;
  SharedPtr<vk::Allocation> local_78;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_68;
  Move<vk::Handle<(vk::HandleType)8>_> local_58;
  VkDevice local_38;
  
  local_38 = Context::getDevice((this->super_TestInstance).m_context);
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  bufferSize = (ulong)size;
  createBuffer(&local_58,(this->super_TestInstance).m_context,bufferSize,0x10);
  allocateAndBindMemory
            (&local_68,(this->super_TestInstance).m_context,
             (VkBuffer)
             local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  memcpy((local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
         ->m_hostPtr,dataPtr,bufferSize);
  ::vk::flushMappedMemoryRange
            (vkd,local_38,
             (VkDeviceMemory)
             ((local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
              .ptr)->m_memory).m_internal,
             (local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
             ptr)->m_offset,bufferSize);
  (__return_storage_ptr__->buffer).m_internal =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->range = bufferSize;
  pAVar5 = (Allocation *)operator_new(0x20);
  pAVar5->m_offset =
       (VkDeviceSize)local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pAVar5->m_hostPtr =
       local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  pAVar5->_vptr_Allocation =
       (_func_int **)local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  (pAVar5->m_memory).m_internal =
       (deUint64)local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
  ;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pAVar5;
  local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
  (local_78.m_state)->strongRefCount = 0;
  (local_78.m_state)->weakRefCount = 0;
  (local_78.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00cef0f0;
  local_78.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pAVar5;
  (local_78.m_state)->strongRefCount = 1;
  (local_78.m_state)->weakRefCount = 1;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
  ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
            ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
              *)&this->m_uniformBuffers,
             (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&local_78);
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_78.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_78.m_ptr = (Allocation *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_78.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_78.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  pAVar5 = local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
  ;
  local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pAVar5;
  local_78.m_state = (SharedPtrStateBase *)operator_new(0x20);
  *(undefined4 *)&((VkDescriptorBufferInfo *)local_78.m_state)->offset = 0;
  *(undefined4 *)((long)&((VkDescriptorBufferInfo *)local_78.m_state)->offset + 4) = 0;
  (((VkDescriptorBufferInfo *)local_78.m_state)->buffer).m_internal =
       (deUint64)&PTR__SharedPtrState_00cf0f58;
  ((VkDescriptorBufferInfo *)local_78.m_state)->range = (VkDeviceSize)pAVar5;
  *(undefined4 *)&((VkDescriptorBufferInfo *)local_78.m_state)->offset = 1;
  *(undefined4 *)((long)&((VkDescriptorBufferInfo *)local_78.m_state)->offset + 4) = 1;
  std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
  emplace_back<de::SharedPtr<vk::Allocation>>
            ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>> *)
             &this->m_uniformAllocs,&local_78);
  pVVar6 = (VkDescriptorBufferInfo *)local_78.m_state;
  if ((VkDescriptorBufferInfo *)local_78.m_state != (VkDescriptorBufferInfo *)0x0) {
    LOCK();
    pVVar2 = (VkDeviceSize *)&(local_78.m_state)->strongRefCount;
    *(int *)pVVar2 = (int)*pVVar2 + -1;
    UNLOCK();
    if ((int)*pVVar2 == 0) {
      local_78.m_ptr = (Allocation *)0x0;
      (**(code **)(((VkBuffer *)&(local_78.m_state)->_vptr_SharedPtrStateBase)->m_internal + 0x10))
                ();
    }
    LOCK();
    piVar3 = (int *)((long)&(local_78.m_state)->strongRefCount + 4);
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    pVVar6 = (VkDescriptorBufferInfo *)local_78.m_state;
    if ((*piVar3 == 0) &&
       ((VkDescriptorBufferInfo *)local_78.m_state != (VkDescriptorBufferInfo *)0x0)) {
      pVVar6 = (VkDescriptorBufferInfo *)
               (**(code **)(((VkBuffer *)&(local_78.m_state)->_vptr_SharedPtrStateBase)->m_internal
                           + 8))();
    }
  }
  if (local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    iVar4 = (*(local_68.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
              .ptr)->_vptr_Allocation[1])();
    pVVar6 = (VkDescriptorBufferInfo *)CONCAT44(extraout_var,iVar4);
  }
  if (local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_58.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    pVVar6 = extraout_RAX;
  }
  return pVVar6;
}

Assistant:

vk::VkDescriptorBufferInfo UniformBlockCaseInstance::addUniformData (deUint32 size, const void* dataPtr)
{
	const VkDevice					vkDevice			= m_context.getDevice();
	const DeviceInterface&			vk					= m_context.getDeviceInterface();

	Move<VkBuffer>					buffer	= createBuffer(m_context, size, VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
	de::MovePtr<Allocation>			alloc	= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

	deMemcpy(alloc->getHostPtr(), dataPtr, size);
	flushMappedMemoryRange(vk, vkDevice, alloc->getMemory(), alloc->getOffset(), size);

	const VkDescriptorBufferInfo			descriptor			=
	{
		*buffer,				// VkBuffer		buffer;
		0u,						// VkDeviceSize	offset;
		size,					// VkDeviceSize	range;

	};

	m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
	m_uniformAllocs.push_back(AllocationSp(alloc.release()));

	return descriptor;
}